

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-concurrency.c
# Opt level: O2

void test_stream_concurrency(void)

{
  uint64_t uVar1;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  quicly_sendbuf_t *sb;
  quicly_stream_id_t stream_id;
  void *pvVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  uint64_t uVar9;
  quicly_conn_t *pqVar10;
  quicly_conn_t *pqVar11;
  int iVar12;
  quicly_cid_plaintext_t *pqVar13;
  size_t sVar14;
  quicly_stream_t *pqVar15;
  quicly_streambuf_t *sbuf;
  uint64_t uVar16;
  uint64_t uVar17;
  undefined1 *buf;
  bool bVar18;
  undefined8 uStack_180;
  ptls_iovec_t pStack_178;
  uint64_t uStack_168;
  size_t sStack_160;
  undefined1 local_158 [8];
  quicly_decoded_packet_t decoded;
  quicly_address_t dest;
  quicly_address_t src;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  iovec raw;
  size_t num_packets;
  quicly_conn_t *local_40;
  quicly_conn_t *server;
  quicly_conn_t *client;
  
  uVar17 = quic_ctx.transport_params.max_udp_payload_size;
  uVar9 = quic_ctx.transport_params.max_streams_bidi;
  lVar6 = -0x158 - (quic_ctx.transport_params.max_streams_bidi * 8 + 0x1f & 0xfffffffffffffff0);
  uVar1 = quic_ctx.transport_params.max_streams_bidi + 1;
  lVar8 = lVar6 - (quic_ctx.transport_params.max_streams_bidi * 8 + 0x17 & 0xfffffffffffffff0);
  buf = local_158 +
        (lVar8 - (quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0)) +
        0x158;
  *(undefined8 *)(buf + -8) = 0x11ccab;
  pqVar13 = new_master_id();
  src._20_8_ = 0;
  uStack_90 = 0;
  *(undefined8 *)(buf + -0x20) = 0;
  *(undefined8 *)(buf + -0x18) = 0;
  *(undefined8 *)(buf + -0x10) = 0;
  *(undefined8 *)(buf + -8) = 0;
  *(undefined8 *)(buf + -0x28) = 0x11cce8;
  iVar12 = quicly_connect(&server,&quic_ctx,"example.com",&fake_address.sa,(sockaddr *)0x0,pqVar13,
                          *(ptls_iovec_t *)(buf + -0x20),
                          *(ptls_handshake_properties_t **)(buf + -0x10),
                          *(quicly_transport_parameters_t **)(buf + -8));
  *(undefined8 *)(buf + -8) = 0x2c;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cd0c;
  _ok((uint)(iVar12 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar10 = server;
  raw.iov_len = 1;
  *(uint64_t *)(buf + -0x10) = uVar17;
  *(undefined8 *)(buf + -0x18) = 0x11cd3d;
  iVar12 = quicly_send(pqVar10,(quicly_address_t *)&decoded._is_stateless_reset_cached,
                       (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),
                       (iovec *)local_88,&raw.iov_len,buf,*(size_t *)(buf + -0x10));
  *(undefined8 *)(buf + -8) = 0x2f;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cd67;
  _ok((uint)(iVar12 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  bVar18 = raw.iov_len == 1;
  *(undefined8 *)(buf + -8) = 0x30;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cd81;
  _ok((uint)bVar18,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  *(undefined8 *)(buf + -8) = 1;
  sVar14 = *(size_t *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cd94;
  sVar14 = decode_packets((quicly_decoded_packet_t *)local_158,(iovec *)local_88,sVar14);
  *(undefined8 *)(buf + -8) = 0x31;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cdae;
  _ok((uint)(sVar14 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  bVar18 = raw.iov_len == 1;
  *(undefined8 *)(buf + -8) = 0x32;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11cdc8;
  _ok((uint)bVar18,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  *(undefined8 *)(buf + -8) = 0x11cdcd;
  pqVar13 = new_master_id();
  *(undefined8 *)(buf + -8) = 0;
  *(quicly_cid_plaintext_t **)(buf + -0x10) = pqVar13;
  *(undefined8 *)(buf + -0x18) = 0x11cdf6;
  iVar12 = quicly_accept(&local_40,&quic_ctx,(sockaddr *)0x0,&fake_address.sa,
                         (quicly_decoded_packet_t *)local_158,
                         (quicly_address_token_plaintext_t *)0x0,
                         *(quicly_cid_plaintext_t **)(buf + -0x10),
                         *(ptls_handshake_properties_t **)(buf + -8));
  *(undefined8 *)(buf + -8) = 0x34;
  uVar7 = *(undefined8 *)(buf + -8);
  *(undefined8 *)(buf + -8) = 0x11ce12;
  _ok((uint)(iVar12 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar11 = server;
  pqVar10 = local_40;
  *(undefined8 *)(buf + -8) = 0x11ce21;
  transmit(pqVar10,pqVar11);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 5;
  sVar14 = *(size_t *)((long)&sStack_160 + lVar8 + 0x158);
  for (uVar17 = 0; pqVar10 = server, uVar16 = uVar1, uVar17 != uVar1; uVar17 = uVar17 + 1) {
    *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11ce4f;
    iVar12 = quicly_open_stream(pqVar10,(quicly_stream_t **)(local_158 + uVar17 * 8 + lVar6 + 0x158)
                                ,0);
    if (iVar12 != 0) {
      *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x3b;
LAB_0011d118:
      uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
      *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d11e;
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
                    ,(uint)uVar7,"void test_stream_concurrency(void)");
    }
    pqVar15 = *(quicly_stream_t **)(local_158 + uVar17 * 8 + lVar6 + 0x158);
    sb = (quicly_sendbuf_t *)pqVar15->data;
    *(quicly_sendbuf_t **)(local_158 + uVar17 * 8 + lVar8 + 0x158) = sb;
    uVar16 = uVar17;
    if ((pqVar15->field_0xb8 & 1) != 0) break;
    *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11ce7d;
    iVar12 = quicly_sendbuf_write(pqVar15,sb,"hello",sVar14);
    if (iVar12 != 0) {
      *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x40;
      goto LAB_0011d118;
    }
  }
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x42;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11ceb8;
  _ok((uint)(uVar16 == uVar9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar11 = server;
  pqVar10 = local_40;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cec5;
  transmit(pqVar11,pqVar10);
  pqVar11 = server;
  pqVar10 = local_40;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11ced2;
  transmit(pqVar10,pqVar11);
  plVar2 = (long *)(local_158 + uVar16 * 8 + lVar6 + 0x158);
  bVar3 = *(byte *)(*plVar2 + 0xb8);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x48;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cefc;
  _ok(bVar3 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar10 = local_40;
  stream_id = *(quicly_stream_id_t *)(plVar2[-1] + 8);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf0d;
  pqVar15 = quicly_get_stream(pqVar10,stream_id);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x4c;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf29;
  _ok((uint)(pqVar15 != (quicly_stream_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pvVar5 = pqVar15->data;
  pqVar15 = (quicly_stream_t *)plVar2[-1];
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf3f;
  quicly_reset_stream(pqVar15,0x3007b);
  pqVar15 = (quicly_stream_t *)plVar2[-1];
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf4d;
  quicly_request_stop(pqVar15,0x301c8);
  pqVar11 = server;
  pqVar10 = local_40;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf5a;
  transmit(pqVar11,pqVar10);
  pqVar11 = server;
  pqVar10 = local_40;
  quic_now = quic_now + 0x19;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf72;
  transmit(pqVar10,pqVar11);
  iVar12 = *(int *)((long)pvVar5 + 0x4c);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x53;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cf91;
  _ok((uint)(iVar12 == 0x3007b),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  iVar12 = *(int *)((long)pvVar5 + 0x48);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x54;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cfb1;
  _ok((uint)(iVar12 == 0x301c8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  iVar12 = *(int *)((long)pvVar5 + 0x50);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x55;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cfcd;
  _ok((uint)(iVar12 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  lVar6 = *(long *)((long)&sStack_160 + uVar16 * 8 + lVar8 + 0x158);
  iVar12 = *(int *)(lVar6 + 0x4c);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x56;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11cff5;
  _ok((uint)(iVar12 == 0x301c8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  iVar12 = *(int *)(lVar6 + 0x50);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x57;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d009;
  _ok(iVar12,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  bVar3 = *(byte *)(*plVar2 + 0xb8);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x5a;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d027;
  _ok(bVar3 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar11 = server;
  pqVar10 = local_40;
  quic_now = quic_now + 0x19;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d03f;
  transmit(pqVar11,pqVar10);
  pqVar11 = server;
  pqVar10 = local_40;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d04c;
  transmit(pqVar10,pqVar11);
  iVar12 = *(int *)((long)pvVar5 + 0x50);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x61;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d061;
  _ok(iVar12,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  uVar4 = *(uint *)(*plVar2 + 0xb8);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x62;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d080;
  _ok(~uVar4 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  pqVar10 = server;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d08e;
  iVar12 = quicly_open_stream(pqVar10,(quicly_stream_t **)(plVar2 + 1),0);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x67;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d0a6;
  _ok((uint)(iVar12 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  bVar3 = ((quicly_stream_t *)plVar2[1])->field_0xb8;
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x68;
  uVar7 = *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d0c3;
  _ok(bVar3 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,uVar7);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d0cc;
  quicly_free(server);
  *(undefined8 *)((long)&sStack_160 + lVar8 + 0x158) = 0x11d0d5;
  quicly_free(local_40);
  return;
}

Assistant:

void test_stream_concurrency(void)
{
    quicly_conn_t *client, *server;
    size_t limit = quic_ctx.transport_params.max_streams_bidi;
    quicly_stream_t *client_streams[limit + 2], *server_stream;
    test_streambuf_t *client_streambufs[limit + 1], *server_streambuf;
    size_t i;
    int ret;

    { /* connect */
        quicly_address_t dest, src;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &dest, &src, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        ok(decode_packets(&decoded, &raw, 1) == 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        transmit(server, client);
    }

    /* open as many streams as we can */
    for (i = 0; i < limit + 1; ++i) {
        ret = quicly_open_stream(client, client_streams + i, 0);
        assert(ret == 0);
        client_streambufs[i] = client_streams[i]->data;
        if (client_streams[i]->streams_blocked)
            break;
        ret = quicly_streambuf_egress_write(client_streams[i], "hello", 5);
        assert(ret == 0);
    }
    ok(i == limit);

    transmit(client, server);
    transmit(server, client);

    /* the last stream is still ID-blocked after 1RT */
    ok(client_streams[i]->streams_blocked);

    /* reset one stream in both directions and close on the client-side */
    server_stream = quicly_get_stream(server, client_streams[i - 1]->stream_id);
    ok(server_stream != NULL);
    server_streambuf = server_stream->data;
    quicly_reset_stream(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    quicly_request_stop(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    transmit(client, server);
    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(server, client);
    ok(server_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    ok(server_streambuf->error_received.stop_sending == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(!server_streambuf->is_detached); /* haven't gotten ACK for reset */
    ok(client_streambufs[i - 1]->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(client_streambufs[i - 1]->is_detached);

    /* the last stream is still ID-blocked */
    ok(client_streams[i]->streams_blocked);

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(client, server);
    transmit(server, client);

    /* we would have free room now that RST of the server-sent side is ACKed */
    ok(server_streambuf->is_detached);
    ok(!client_streams[i]->streams_blocked);
    ++i;

    /* but we cannot open one more */
    ret = quicly_open_stream(client, client_streams + i, 0);
    ok(ret == 0);
    ok(client_streams[i]->streams_blocked);

    quicly_free(client);
    quicly_free(server);
}